

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O0

Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> * __thiscall
cnn::Tensor::batch_matrix(Tensor *this,uint bid)

{
  uint uVar1;
  uint uVar2;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *this_00;
  uint in_EDX;
  Dim *in_RSI;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *in_RDI;
  Stride<0,_0> *this_01;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *rows;
  Stride<0,_0> *dataPtr;
  
  this_01 = *(Stride<0,_0> **)(in_RSI[1].d + 1);
  uVar2 = in_RSI->bd;
  rows = in_RDI;
  uVar1 = Dim::batch_size(in_RSI);
  dataPtr = this_01 + (ulong)((in_EDX % uVar2) * uVar1) * 2;
  uVar2 = Dim::rows(in_RSI);
  this_00 = (Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)(ulong)uVar2;
  Dim::cols(in_RSI);
  Eigen::Stride<0,_0>::Stride(this_01);
  Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>::Map
            (this_00,(PointerArgType)dataPtr,(Index)rows,(Index)in_RSI,this_01);
  return in_RDI;
}

Assistant:

Eigen::Map<Eigen::MatrixXf> batch_matrix(unsigned bid) {
    return Eigen::Map<Eigen::MatrixXf>(v + (bid%d.bd)*d.batch_size(), d.rows(), d.cols());
  }